

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot.cpp
# Opt level: O0

void __thiscall fsm_def::fsm_def(fsm_def *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e;
  undefined1 local_5d;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  fsm_def *this_local;
  
  local_10 = (undefined1  [8])this;
  std::vector<transition,_std::allocator<transition>_>::vector(&this->transitions);
  std::__cxx11::string::string((string *)&this->name);
  local_5d = 1;
  local_48 = &local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"node [shape = circle]",&local_49);
  local_5d = 0;
  local_20 = &local_40;
  local_18 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_5e);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->general_options,__l,&local_5e);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_5e);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_98 = local_98 + -1;
    std::__cxx11::string::~string((string *)local_98);
  } while (local_98 != &local_40);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

fsm_def()
        : general_options({"node [shape = circle]"})
    {

    }